

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O0

void operator_suite::less(void)

{
  initializer_list<int> input;
  bool bVar1;
  iterator __x;
  basic_iterator<int> local_908;
  iterator local_8f8;
  iterator local_8e8;
  basic_iterator<int> local_8d8;
  iterator local_8c8;
  iterator local_8b8;
  basic_iterator<int> local_8a8;
  iterator local_898;
  iterator local_888;
  basic_iterator<int> local_878;
  iterator local_868;
  iterator local_858;
  iterator local_848;
  iterator local_838;
  basic_iterator<int> local_828;
  iterator local_818;
  iterator local_808;
  basic_iterator<int> local_7f8;
  iterator local_7e8;
  iterator local_7d8;
  basic_iterator<int> local_7c8;
  iterator local_7b8;
  iterator local_7a8;
  basic_iterator<int> local_798;
  iterator local_788;
  iterator local_778;
  iterator local_768;
  iterator local_758;
  basic_iterator<int> local_748;
  iterator local_738;
  iterator local_728;
  basic_iterator<int> local_718;
  iterator local_708;
  iterator local_6f8;
  basic_iterator<int> local_6e8;
  iterator local_6d8;
  iterator local_6c8;
  basic_iterator<int> local_6b8;
  iterator local_6a8;
  iterator local_698;
  iterator local_688;
  iterator local_678;
  basic_iterator<int> local_668;
  iterator local_658;
  iterator local_648;
  basic_iterator<int> local_638;
  iterator local_628;
  iterator local_618;
  basic_iterator<int> local_608;
  iterator local_5f8;
  iterator local_5e8;
  basic_iterator<int> local_5d8;
  iterator local_5c8;
  iterator local_5b8;
  iterator local_5a8;
  iterator local_598;
  basic_iterator<int> local_588;
  iterator local_578;
  iterator local_568;
  basic_iterator<int> local_558;
  iterator local_548;
  iterator local_538;
  basic_iterator<int> local_528;
  iterator local_518;
  iterator local_508;
  basic_iterator<int> local_4f8;
  iterator local_4e8;
  iterator local_4d8;
  iterator local_4c8;
  iterator local_4b8;
  basic_iterator<int> local_4a8;
  iterator local_498;
  iterator local_488;
  basic_iterator<int> local_478;
  iterator local_468;
  iterator local_458;
  basic_iterator<int> local_448;
  iterator local_438;
  iterator local_428;
  basic_iterator<int> local_418;
  iterator local_408;
  iterator local_3f8;
  iterator local_3e8;
  iterator local_3d8;
  basic_iterator<int> local_3c8;
  iterator local_3b8;
  iterator local_3a8;
  basic_iterator<int> local_398;
  iterator local_388;
  iterator local_378;
  basic_iterator<int> local_368;
  iterator local_358;
  iterator local_348;
  basic_iterator<int> local_338;
  iterator local_328;
  iterator local_318;
  iterator local_308;
  iterator local_2f8;
  basic_iterator<int> local_2e8;
  iterator local_2d8;
  iterator local_2c8;
  basic_iterator<int> local_2b8;
  iterator local_2a8;
  iterator local_298;
  basic_iterator<int> local_288;
  iterator local_278;
  iterator local_268;
  basic_iterator<int> local_258;
  iterator local_248;
  iterator local_238;
  iterator local_228;
  iterator local_218;
  basic_iterator<int> local_208;
  iterator local_1f8;
  iterator local_1e8;
  basic_iterator<int> local_1d8;
  iterator local_1c8;
  iterator local_1b8;
  basic_iterator<int> local_1a8;
  iterator local_198;
  iterator local_188;
  basic_iterator<int> local_178;
  iterator local_168;
  iterator local_158;
  iterator local_148;
  iterator local_138;
  basic_iterator<int> local_128;
  iterator local_118;
  iterator local_108;
  basic_iterator<int> local_f8;
  iterator local_e8;
  iterator local_d8;
  basic_iterator<int> local_c8;
  iterator local_b8;
  iterator local_a8;
  basic_iterator<int> local_98;
  iterator local_88;
  iterator local_78;
  iterator local_68;
  int local_58 [4];
  iterator local_48;
  undefined8 local_40;
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.next = 0;
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_38,
             (value_type (*) [4])&span.member.next);
  local_58[0] = 0xb;
  local_58[1] = 0x16;
  local_58[2] = 0x21;
  local_58[3] = 0x2c;
  local_48 = local_58;
  local_40 = 4;
  input._M_len = 4;
  input._M_array = local_48;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input);
  local_68 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_78 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_68,&local_78);
  boost::detail::test_impl
            ("!(span.begin() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x524,"void operator_suite::less()",!bVar1);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_a8 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_98 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (local_a8,1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_88,&local_98);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 1)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x525,"void operator_suite::less()",bVar1);
  local_b8 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_d8 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_c8 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (local_d8,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_b8,&local_c8);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 2)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x526,"void operator_suite::less()",bVar1);
  local_e8 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_108 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_f8 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                       (local_108,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_e8,&local_f8);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 3)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x527,"void operator_suite::less()",bVar1);
  local_118 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_138 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_128 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_138,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_118,&local_128);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 4)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x528,"void operator_suite::less()",bVar1);
  local_148 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_158 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_148,&local_158);
  boost::detail::test_impl
            ("!(span.end() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x52a,"void operator_suite::less()",!bVar1);
  local_168 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_188 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_178 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_188,1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_168,&local_178);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 1))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x52b,"void operator_suite::less()",!bVar1);
  local_198 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_1b8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_1a8 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_1b8,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_198,&local_1a8);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x52c,"void operator_suite::less()",!bVar1);
  local_1c8 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_1e8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_1d8 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_1e8,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_1c8,&local_1d8);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 3))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x52d,"void operator_suite::less()",!bVar1);
  local_1f8 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_218 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_208 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_218,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_1f8,&local_208);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 4))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x52e,"void operator_suite::less()",!bVar1);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,0x37);
  local_228 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_238 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_228,&local_238);
  boost::detail::test_impl
            ("!(span.begin() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x531,"void operator_suite::less()",!bVar1);
  local_248 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_268 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_258 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_268,1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_248,&local_258);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 1)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x532,"void operator_suite::less()",bVar1);
  local_278 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_298 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_288 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_298,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_278,&local_288);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 2)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x533,"void operator_suite::less()",bVar1);
  local_2a8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_2c8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_2b8 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_2c8,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_2a8,&local_2b8);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 3)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x534,"void operator_suite::less()",bVar1);
  local_2d8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_2f8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_2e8 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_2f8,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_2d8,&local_2e8);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 4)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x535,"void operator_suite::less()",bVar1);
  local_308 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_318 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_308,&local_318);
  boost::detail::test_impl
            ("!(span.end() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x537,"void operator_suite::less()",!bVar1);
  local_328 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_348 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_338 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_348,1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_328,&local_338);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 1))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x538,"void operator_suite::less()",!bVar1);
  local_358 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_378 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_368 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_378,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_358,&local_368);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x539,"void operator_suite::less()",!bVar1);
  local_388 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_3a8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_398 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_3a8,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_388,&local_398);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 3))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x53a,"void operator_suite::less()",!bVar1);
  local_3b8 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_3d8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_3c8 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_3d8,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_3b8,&local_3c8);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 4))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x53b,"void operator_suite::less()",!bVar1);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,0x42);
  local_3e8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_3f8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_3e8,&local_3f8);
  boost::detail::test_impl
            ("!(span.begin() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x53e,"void operator_suite::less()",!bVar1);
  local_408 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_428 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_418 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_428,1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_408,&local_418);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 1)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x53f,"void operator_suite::less()",bVar1);
  local_438 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_458 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_448 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_458,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_438,&local_448);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 2)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x540,"void operator_suite::less()",bVar1);
  local_468 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_488 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_478 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_488,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_468,&local_478);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 3)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x541,"void operator_suite::less()",bVar1);
  local_498 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_4b8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_4a8 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_4b8,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_498,&local_4a8);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 4)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x542,"void operator_suite::less()",bVar1);
  local_4c8 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_4d8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_4c8,&local_4d8);
  boost::detail::test_impl
            ("!(span.end() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x544,"void operator_suite::less()",!bVar1);
  local_4e8 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_508 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_4f8 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_508,1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_4e8,&local_4f8);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 1))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x545,"void operator_suite::less()",!bVar1);
  local_518 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_538 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_528 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_538,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_518,&local_528);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x546,"void operator_suite::less()",!bVar1);
  local_548 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_568 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_558 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_568,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_548,&local_558);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 3))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x547,"void operator_suite::less()",!bVar1);
  local_578 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_598 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_588 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_598,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_578,&local_588);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 4))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x548,"void operator_suite::less()",!bVar1);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,0x4d);
  local_5a8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_5b8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_5a8,&local_5b8);
  boost::detail::test_impl
            ("!(span.begin() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x54b,"void operator_suite::less()",!bVar1);
  local_5c8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_5e8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_5d8 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_5e8,1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_5c8,&local_5d8);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 1)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x54c,"void operator_suite::less()",bVar1);
  local_5f8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_618 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_608 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_618,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_5f8,&local_608);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 2)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x54d,"void operator_suite::less()",bVar1);
  local_628 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_648 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_638 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_648,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_628,&local_638);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 3)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x54e,"void operator_suite::less()",bVar1);
  local_658 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_678 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_668 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_678,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_658,&local_668);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 4)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x54f,"void operator_suite::less()",bVar1);
  local_688 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_698 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_688,&local_698);
  boost::detail::test_impl
            ("!(span.end() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x551,"void operator_suite::less()",!bVar1);
  local_6a8 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_6c8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_6b8 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_6c8,1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_6a8,&local_6b8);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 1))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x552,"void operator_suite::less()",!bVar1);
  local_6d8 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_6f8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_6e8 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_6f8,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_6d8,&local_6e8);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x553,"void operator_suite::less()",!bVar1);
  local_708 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_728 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_718 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_728,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_708,&local_718);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 3))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x554,"void operator_suite::less()",!bVar1);
  local_738 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_758 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_748 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_758,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_738,&local_748);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 4))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x555,"void operator_suite::less()",!bVar1);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,0x58);
  local_768 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_778 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_768,&local_778);
  boost::detail::test_impl
            ("!(span.begin() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x558,"void operator_suite::less()",!bVar1);
  local_788 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_7a8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_798 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_7a8,1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_788,&local_798);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 1)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x559,"void operator_suite::less()",bVar1);
  local_7b8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_7d8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_7c8 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_7d8,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_7b8,&local_7c8);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 2)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x55a,"void operator_suite::less()",bVar1);
  local_7e8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_808 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_7f8 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_808,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_7e8,&local_7f8);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 3)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x55b,"void operator_suite::less()",bVar1);
  local_818 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_838 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_828 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_838,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_818,&local_828);
  boost::detail::test_impl
            ("span.begin() < std::next(span.begin(), 4)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x55c,"void operator_suite::less()",bVar1);
  local_848 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_858 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_848,&local_858);
  boost::detail::test_impl
            ("!(span.end() < span.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x55e,"void operator_suite::less()",!bVar1);
  local_868 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_888 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_878 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_888,1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_868,&local_878);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 1))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x55f,"void operator_suite::less()",!bVar1);
  local_898 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_8b8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_8a8 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_8b8,2);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_898,&local_8a8);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x560,"void operator_suite::less()",!bVar1);
  local_8c8 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_8e8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_8d8 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (local_8e8,3);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_8c8,&local_8d8);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 3))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x561,"void operator_suite::less()",!bVar1);
  local_8f8 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  __x = vista::circular_view<int,_18446744073709551615UL>::begin
                  ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_908 = std::next<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                        (__x,4);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator<
                    (&local_8f8,&local_908);
  boost::detail::test_impl
            ("!(span.end() < std::next(span.begin(), 4))",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x562,"void operator_suite::less()",(bool)(bVar1 - 1U & 1));
  return;
}

Assistant:

void less()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44 };
    BOOST_TEST(!(span.begin() < span.begin()));
    BOOST_TEST(span.begin() < std::next(span.begin(), 1));
    BOOST_TEST(span.begin() < std::next(span.begin(), 2));
    BOOST_TEST(span.begin() < std::next(span.begin(), 3));
    BOOST_TEST(span.begin() < std::next(span.begin(), 4));

    BOOST_TEST(!(span.end() < span.begin()));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 1)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 2)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 3)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 4)));

    span.push_back(55);
    BOOST_TEST(!(span.begin() < span.begin()));
    BOOST_TEST(span.begin() < std::next(span.begin(), 1));
    BOOST_TEST(span.begin() < std::next(span.begin(), 2));
    BOOST_TEST(span.begin() < std::next(span.begin(), 3));
    BOOST_TEST(span.begin() < std::next(span.begin(), 4));

    BOOST_TEST(!(span.end() < span.begin()));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 1)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 2)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 3)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 4)));

    span.push_back(66);
    BOOST_TEST(!(span.begin() < span.begin()));
    BOOST_TEST(span.begin() < std::next(span.begin(), 1));
    BOOST_TEST(span.begin() < std::next(span.begin(), 2));
    BOOST_TEST(span.begin() < std::next(span.begin(), 3));
    BOOST_TEST(span.begin() < std::next(span.begin(), 4));

    BOOST_TEST(!(span.end() < span.begin()));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 1)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 2)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 3)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 4)));

    span.push_back(77);
    BOOST_TEST(!(span.begin() < span.begin()));
    BOOST_TEST(span.begin() < std::next(span.begin(), 1));
    BOOST_TEST(span.begin() < std::next(span.begin(), 2));
    BOOST_TEST(span.begin() < std::next(span.begin(), 3));
    BOOST_TEST(span.begin() < std::next(span.begin(), 4));

    BOOST_TEST(!(span.end() < span.begin()));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 1)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 2)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 3)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 4)));

    span.push_back(88);
    BOOST_TEST(!(span.begin() < span.begin()));
    BOOST_TEST(span.begin() < std::next(span.begin(), 1));
    BOOST_TEST(span.begin() < std::next(span.begin(), 2));
    BOOST_TEST(span.begin() < std::next(span.begin(), 3));
    BOOST_TEST(span.begin() < std::next(span.begin(), 4));

    BOOST_TEST(!(span.end() < span.begin()));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 1)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 2)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 3)));
    BOOST_TEST(!(span.end() < std::next(span.begin(), 4)));
}